

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Read<double>(KDataStream *this,double *T)

{
  ushort uVar1;
  pointer puVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  NetToDataType<double> OctArray;
  
  OctArray.m_Value = *T;
  puVar2 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = this->m_ui16CurrentWritePos;
  lVar17 = 0;
  do {
    *(uchar *)((long)&OctArray + lVar17) = puVar2[(uint)uVar1 + (int)lVar17 & 0xffff];
    lVar16 = lVar17 + 1;
    this->m_ui16CurrentWritePos = (short)lVar17 + uVar1 + 1;
    lVar17 = lVar16;
  } while (lVar16 != 8);
  if (this->m_MachineEndian != this->m_NetEndian) {
    auVar5._8_6_ = 0;
    auVar5._0_8_ = OctArray;
    auVar5[0xe] = OctArray._7_1_;
    auVar6._8_4_ = 0;
    auVar6._0_8_ = OctArray;
    auVar6[0xc] = OctArray._6_1_;
    auVar6._13_2_ = auVar5._13_2_;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = OctArray;
    auVar7._12_3_ = auVar6._12_3_;
    auVar8._8_2_ = 0;
    auVar8._0_8_ = OctArray;
    auVar8[10] = OctArray._5_1_;
    auVar8._11_4_ = auVar7._11_4_;
    auVar9._8_2_ = 0;
    auVar9._0_8_ = OctArray;
    auVar9._10_5_ = auVar8._10_5_;
    auVar10[8] = OctArray._4_1_;
    auVar10._0_8_ = OctArray;
    auVar10._9_6_ = auVar9._9_6_;
    auVar18[7] = 0;
    auVar18._0_7_ = auVar10._8_7_;
    auVar12._7_8_ = 0;
    auVar12._0_7_ = auVar10._8_7_;
    auVar14._1_8_ = SUB158(auVar12 << 0x40,7);
    auVar14[0] = OctArray._3_1_;
    auVar14._9_6_ = 0;
    auVar13._1_10_ = SUB1510(auVar14 << 0x30,5);
    auVar13[0] = OctArray._2_1_;
    auVar15._11_4_ = 0;
    auVar15._0_11_ = auVar13;
    auVar11._3_12_ = SUB1512(auVar15 << 0x20,3);
    auVar11[2] = OctArray._1_1_;
    auVar11[1] = 0;
    auVar11[0] = OctArray._0_1_;
    auVar18._8_4_ = auVar11._0_4_;
    auVar18._12_4_ = auVar13._0_4_;
    auVar18 = pshuflw(auVar18,auVar18,0x1b);
    auVar18 = pshufhw(auVar18,auVar18,0x1b);
    sVar3 = auVar18._0_2_;
    sVar4 = auVar18._2_2_;
    OctArray.field_0.m_Octs[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar18[2] - (0xff < sVar4);
    OctArray.field_0.m_Octs[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[0] - (0xff < sVar3);
    sVar3 = auVar18._4_2_;
    OctArray.field_0.m_Octs[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3);
    sVar3 = auVar18._6_2_;
    OctArray.field_0.m_Octs[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[6] - (0xff < sVar3);
    sVar3 = auVar18._8_2_;
    OctArray.field_0.m_Octs[4] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[8] - (0xff < sVar3);
    sVar3 = auVar18._10_2_;
    OctArray.field_0.m_Octs[5] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[10] - (0xff < sVar3);
    sVar3 = auVar18._12_2_;
    OctArray.field_0.m_Octs[6] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[0xc] - (0xff < sVar3);
    sVar3 = auVar18._14_2_;
    OctArray.field_0.m_Octs[7] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[0xe] - (0xff < sVar3);
  }
  *T = (double)OctArray;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}